

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue::TensorValue(TensorValue *this,TensorValue *from)

{
  ValueCase VVar1;
  TensorValue_RepeatedFloats *this_00;
  TensorValue_RepeatedFloats *from_00;
  TensorValue_RepeatedInts *this_01;
  TensorValue_RepeatedInts *from_01;
  TensorValue_RepeatedBools *this_02;
  TensorValue_RepeatedBools *from_02;
  TensorValue_RepeatedStrings *this_03;
  TensorValue_RepeatedStrings *from_03;
  TensorValue_RepeatedLongInts *this_04;
  TensorValue_RepeatedLongInts *from_04;
  TensorValue_RepeatedDoubles *this_05;
  TensorValue_RepeatedDoubles *from_05;
  TensorValue_RepeatedBytes *this_06;
  TensorValue_RepeatedBytes *from_06;
  TensorValue *from_local;
  TensorValue *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TensorValue_006f0958;
  ValueUnion::ValueUnion((ValueUnion *)&this->value_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  clear_has_value(this);
  VVar1 = value_case(from);
  switch(VVar1) {
  case VALUE_NOT_SET:
    break;
  case kFloats:
    this_00 = _internal_mutable_floats(this);
    from_00 = _internal_floats(from);
    TensorValue_RepeatedFloats::MergeFrom(this_00,from_00);
    break;
  case kInts:
    this_01 = _internal_mutable_ints(this);
    from_01 = _internal_ints(from);
    TensorValue_RepeatedInts::MergeFrom(this_01,from_01);
    break;
  case kBools:
    this_02 = _internal_mutable_bools(this);
    from_02 = _internal_bools(from);
    TensorValue_RepeatedBools::MergeFrom(this_02,from_02);
    break;
  case kStrings:
    this_03 = _internal_mutable_strings(this);
    from_03 = _internal_strings(from);
    TensorValue_RepeatedStrings::MergeFrom(this_03,from_03);
    break;
  case kLongInts:
    this_04 = _internal_mutable_longints(this);
    from_04 = _internal_longints(from);
    TensorValue_RepeatedLongInts::MergeFrom(this_04,from_04);
    break;
  case kDoubles:
    this_05 = _internal_mutable_doubles(this);
    from_05 = _internal_doubles(from);
    TensorValue_RepeatedDoubles::MergeFrom(this_05,from_05);
    break;
  case kBytes:
    this_06 = _internal_mutable_bytes(this);
    from_06 = _internal_bytes(from);
    TensorValue_RepeatedBytes::MergeFrom(this_06,from_06);
  }
  return;
}

Assistant:

TensorValue::TensorValue(const TensorValue& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kFloats: {
      _internal_mutable_floats()->::CoreML::Specification::MILSpec::TensorValue_RepeatedFloats::MergeFrom(from._internal_floats());
      break;
    }
    case kInts: {
      _internal_mutable_ints()->::CoreML::Specification::MILSpec::TensorValue_RepeatedInts::MergeFrom(from._internal_ints());
      break;
    }
    case kBools: {
      _internal_mutable_bools()->::CoreML::Specification::MILSpec::TensorValue_RepeatedBools::MergeFrom(from._internal_bools());
      break;
    }
    case kStrings: {
      _internal_mutable_strings()->::CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::MergeFrom(from._internal_strings());
      break;
    }
    case kLongInts: {
      _internal_mutable_longints()->::CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts::MergeFrom(from._internal_longints());
      break;
    }
    case kDoubles: {
      _internal_mutable_doubles()->::CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles::MergeFrom(from._internal_doubles());
      break;
    }
    case kBytes: {
      _internal_mutable_bytes()->::CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::MergeFrom(from._internal_bytes());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.TensorValue)
}